

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_kernel.c
# Opt level: O0

int mk_kernel_features_print(char *buffer,size_t size,mk_server *server)

{
  int iVar1;
  bool bVar2;
  uint local_28;
  int local_24;
  int features;
  int offset;
  mk_server *server_local;
  size_t size_local;
  char *buffer_local;
  
  local_24 = 0;
  bVar2 = (server->kernel_features & 1U) != 0;
  if (bVar2) {
    local_24 = snprintf(buffer,size,"%s","TCP_FASTOPEN ");
  }
  local_28 = (uint)bVar2;
  if ((server->kernel_features & 2U) != 0) {
    if (server->scheduler_mode == '\0') {
      iVar1 = snprintf(buffer + local_24,size - (long)local_24,"%s!%s","\x1b[1m\x1b[91m","\x1b[0m");
      local_24 = iVar1 + local_24;
    }
    iVar1 = snprintf(buffer + local_24,size - (long)local_24,"%s","SO_REUSEPORT ");
    local_24 = iVar1 + local_24;
    local_28 = local_28 + 1;
  }
  if ((server->kernel_features & 4U) != 0) {
    snprintf(buffer + local_24,size - (long)local_24,"%s","TCP_AUTOCORKING ");
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

int mk_kernel_features_print(char *buffer, size_t size,
                             struct mk_server *server)
{
    int offset = 0;
    int features = 0;

    if (server->kernel_features & MK_KERNEL_TCP_FASTOPEN) {
        offset += snprintf(buffer, size - offset, "%s", "TCP_FASTOPEN ");
        features++;
    }

    if (server->kernel_features & MK_KERNEL_SO_REUSEPORT) {
        if (server->scheduler_mode == MK_SCHEDULER_FAIR_BALANCING) {
            offset += snprintf(buffer + offset, size - offset,
                               "%s!%s", ANSI_BOLD ANSI_RED, ANSI_RESET);
        }
        offset += snprintf(buffer + offset, size - offset, "%s", "SO_REUSEPORT ");
        features++;
    }

    if (server->kernel_features & MK_KERNEL_TCP_AUTOCORKING) {
        snprintf(buffer + offset, size - offset, "%s", "TCP_AUTOCORKING ");
        features++;
    }

    return features;
}